

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

shared_ptr<wallet::CWallet> __thiscall wallet::TestLoadWallet(wallet *this,WalletContext *context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  pointer *__ptr;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar5;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  DatabaseStatus status;
  bilingual_str error;
  DatabaseOptions options;
  long *local_118;
  long *local_110;
  vector<bilingual_str,_std::allocator<bilingual_str>_> local_108;
  DatabaseStatus local_e4;
  string local_e0;
  bilingual_str local_c0;
  DatabaseOptions local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_80.require_existing = false;
  local_80.require_create = false;
  local_80.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
  super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged = false;
  paVar2 = &local_80.create_passphrase.field_2;
  local_80.create_passphrase._M_string_length = 0;
  local_80.create_passphrase.field_2._M_local_buf[0] = '\0';
  local_80.verify = true;
  local_80.use_unsafe_sync = false;
  local_80.use_shared_memory = false;
  local_80.max_log_mb = 100;
  local_80.create_flags = 0x400000000;
  paVar1 = &local_c0.original.field_2;
  local_c0.original._M_string_length = 0;
  local_c0.original.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_c0.translated.field_2;
  local_c0.translated._M_string_length = 0;
  local_c0.translated.field_2._M_local_buf[0] = '\0';
  local_108.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_c0.original._M_dataplus._M_p = (pointer)paVar1;
  local_c0.translated._M_dataplus._M_p = (pointer)paVar3;
  local_80.create_passphrase._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
  MakeWalletDatabase((wallet *)&local_110,&local_e0,&local_80,&local_e4,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_118 = local_110;
  local_110 = (long *)0x0;
  TestLoadWallet(this,(unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       )&local_118,context,local_80.create_flags);
  if (local_118 != (long *)0x0) {
    (**(code **)(*local_118 + 8))();
  }
  local_118 = (long *)0x0;
  if (local_110 != (long *)0x0) {
    (**(code **)(*local_110 + 8))();
  }
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&local_108);
  _Var4._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.translated._M_dataplus._M_p != paVar3) {
    operator_delete(local_c0.translated._M_dataplus._M_p,
                    CONCAT71(local_c0.translated.field_2._M_allocated_capacity._1_7_,
                             local_c0.translated.field_2._M_local_buf[0]) + 1);
    _Var4._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.original._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.original._M_dataplus._M_p,
                    CONCAT71(local_c0.original.field_2._M_allocated_capacity._1_7_,
                             local_c0.original.field_2._M_local_buf[0]) + 1);
    _Var4._M_pi = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
       *)local_80.create_passphrase._M_dataplus._M_p != paVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::_M_destroy
              (&local_80.create_passphrase,
               CONCAT71(local_80.create_passphrase.field_2._M_allocated_capacity._1_7_,
                        local_80.create_passphrase.field_2._M_local_buf[0]));
    _Var4._M_pi = extraout_RDX_02;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sVar5.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    sVar5.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<wallet::CWallet>)
           sVar5.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> TestLoadWallet(WalletContext& context)
{
    DatabaseOptions options;
    options.create_flags = WALLET_FLAG_DESCRIPTORS;
    DatabaseStatus status;
    bilingual_str error;
    std::vector<bilingual_str> warnings;
    auto database = MakeWalletDatabase("", options, status, error);
    return TestLoadWallet(std::move(database), context, options.create_flags);
}